

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

string_t duckdb::CastFromPointer::Operation<unsigned_long>(uintptr_t input,Vector *vector)

{
  unsigned_long *in_RCX;
  anon_union_16_2_67f50693_for_value aVar1;
  string s;
  uintptr_t local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_38 = input;
  duckdb_fmt::v6::format<char[7],unsigned_long&,char>
            (&local_30,(v6 *)"0x{:x}",(char (*) [7])&local_38,in_RCX);
  aVar1.pointer = (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(vector,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

string_t CastFromPointer::Operation(uintptr_t input, Vector &vector) {
	std::string s = duckdb_fmt::format("0x{:x}", input);
	return StringVector::AddString(vector, s);
}